

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::ValidateSegment<double>(SparseArraySegment<double> *seg)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if ((seg != (SparseArraySegment<double> *)0x0) && (Configuration::Global != '\0')) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      for (uVar4 = (ulong)(seg->super_SparseArraySegmentBase).length;
          uVar4 < (seg->super_SparseArraySegmentBase).size; uVar4 = uVar4 + 1) {
        if (*(undefined1 **)
             (&(((SparseArraySegment<double> *)(&seg->super_SparseArraySegmentBase + 1))->
               super_SparseArraySegmentBase).left + uVar4 * 2) != &DAT_fff80002fff80002) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2ede,
                                      "(SparseArraySegment<T>::IsMissingItem(&seg->elements[i]))",
                                      "Non missing value the end of the segment");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
      }
      seg = (SparseArraySegment<double> *)(seg->super_SparseArraySegmentBase).next.ptr;
    } while ((SparseArraySegmentBase *)seg != (SparseArraySegmentBase *)0x0);
  }
  return;
}

Assistant:

void JavascriptArray::ValidateSegment(SparseArraySegment<T>* seg)
    {
        if (!Js::Configuration::Global.flags.ArrayValidate)
        {
            return;
        }

        while (seg)
        {
            uint32 i = seg->length;
            while (i < seg->size)
            {
                AssertMsg(SparseArraySegment<T>::IsMissingItem(&seg->elements[i]), "Non missing value the end of the segment");
                i++;
            }

            seg = SparseArraySegment<T>::From(seg->next);
        }
    }